

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O2

void * check_label(Scope *current,token *id)

{
  void *pvVar1;
  
  while( true ) {
    if (current == (Scope *)0x0) {
      return (void *)0x0;
    }
    if (current->type == FUNCTION_SCOPE) break;
    current = current->parent;
  }
  pvVar1 = Map_Check((Map *)(current + 1),id->data,id->data_size);
  return pvVar1;
}

Assistant:

void* check_label(struct Scope *current,struct token *id)
{
	void *hold;
	hold=NULL;
	while(current!=NULL && current->type!=FUNCTION_SCOPE)
	{
		current=current->parent;
	}

	if(current!=NULL)
	{
		hold=Map_Check(&((struct Function_Scope*)current)->labels,id->data,id->data_size);
	}
	return hold;
}